

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O0

Block * Js::CompoundString::Block::New
                  (void *buffer,CharCount usedCharLength,bool reserveMoreSpace,Recycler *recycler)

{
  code *pcVar1;
  CharCount charLength;
  void *buffer_00;
  bool bVar2;
  CharCount charCapacity;
  undefined4 *puVar3;
  Recycler *pRVar4;
  Block *this;
  TrackAllocData local_50;
  uint local_24;
  Recycler *pRStack_20;
  uint size;
  Recycler *recycler_local;
  bool reserveMoreSpace_local;
  void *pvStack_10;
  CharCount usedCharLength_local;
  void *buffer_local;
  
  pRStack_20 = recycler;
  recycler_local._3_1_ = reserveMoreSpace;
  recycler_local._4_4_ = usedCharLength;
  pvStack_10 = buffer;
  if (buffer == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x4a,"(buffer)","buffer");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (pRStack_20 == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x4b,"(recycler)","recycler");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_24 = SizeFromUsedCharLength(recycler_local._4_4_);
  if ((recycler_local._3_1_ & 1) != 0) {
    local_24 = GrowSize(local_24);
  }
  pRVar4 = pRStack_20;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&typeinfo,(ulong)local_24 - 0x18,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
             ,0x50);
  pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,&local_50);
  this = (Block *)new<Memory::Recycler>(0x18,pRVar4,0x446fd0,0);
  buffer_00 = pvStack_10;
  charLength = recycler_local._4_4_;
  charCapacity = CharCapacityFromSize(local_24);
  Block(this,buffer_00,charLength,charCapacity);
  return this;
}

Assistant:

CompoundString::Block *CompoundString::Block::New(
        const void *const buffer,
        const CharCount usedCharLength,
        const bool reserveMoreSpace,
        Recycler *const recycler)
    {
        Assert(buffer);
        Assert(recycler);

        uint size = SizeFromUsedCharLength(usedCharLength);
        if(reserveMoreSpace)
            size = GrowSize(size);
        return RecyclerNewPlus(recycler, size - sizeof(Block), Block, buffer, usedCharLength, CharCapacityFromSize(size));
    }